

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_4::checkOpenEXRFile(char *fileName,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  Header *pHVar9;
  ulong uVar10;
  undefined7 in_register_00000009;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  bool bVar11;
  bool bVar12;
  exr_context_t f;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  MultiPartInputFile multi;
  exr_context_t local_d8;
  size_t local_d0;
  _priv_exr_context_t local_c8;
  undefined7 uStack_c7;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  if ((int)CONCAT71(in_register_00000009,runCoreCheck) == 0) {
    local_38 = Imf_3_4::CompositeDeepScanLine::getMaximumSampleCount();
    Imf_3_4::Header::getMaxImageSize(&local_ac,&local_b0);
    Imf_3_4::Header::getMaxImageSize(&local_b4,&local_b8);
    if (reduceMemory || reduceTime) {
      Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
      Imf_3_4::Header::setMaxImageSize(0x800,0x800);
      iVar7 = 0x200;
      iVar6 = 0x200;
    }
    else {
      iVar7 = 0x4000;
      iVar6 = 0x4000;
    }
    Imf_3_4::Header::setMaxTileSize(iVar7,iVar6);
    local_d8 = &local_c8;
    local_d0 = 0;
    local_c8 = (_priv_exr_context_t)0x0;
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&local_a8,fileName,iVar6,true);
    Imf_3_4::MultiPartInputFile::header((int)&local_a8);
    Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_d8);
    cVar4 = Imf_3_4::isTiled((string *)&local_d8);
    if (cVar4 == '\0') {
      bVar12 = false;
    }
    else {
      Imf_3_4::MultiPartInputFile::header((int)&local_a8);
      puVar8 = (uint *)Imf_3_4::Header::tileDescription();
      uVar1 = *puVar8;
      uVar2 = puVar8[1];
      pHVar9 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&local_a8);
      iVar6 = Imf_3_4::calculateBytesPerPixel(pHVar9);
      if ((local_d0 == DAT_0012aa60) &&
         ((local_d0 == 0 || (iVar7 = bcmp(local_d8,DEEPTILE_abi_cxx11_,local_d0), iVar7 == 0)))) {
        uVar10 = 4;
        if (4 < (ulong)(long)iVar6) {
          uVar10 = (long)iVar6;
        }
      }
      else {
        uVar10 = (long)iVar6;
      }
      bVar12 = 1000000 < (ulong)uVar2 * (ulong)uVar1 * uVar10;
    }
    bVar3 = anon_unknown_0::readMultiPart((MultiPartInputFile *)&local_a8,reduceMemory,reduceTime);
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
    }
    if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
    }
    if (!reduceMemory) {
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&local_a8,fileName,iVar6);
      bVar5 = anon_unknown_0::readRgba((RgbaInputFile *)&local_a8,reduceTime,reduceTime_00);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&local_a8);
      bVar11 = bVar3;
      if (((bVar5) && (bVar11 = true, local_d0 == DAT_0012aa60)) && (bVar11 = bVar3, local_d0 != 0))
      {
        iVar6 = bcmp(local_d8,DEEPTILE_abi_cxx11_,local_d0);
        bVar11 = true;
        if (iVar6 == 0) {
          bVar11 = bVar3;
        }
      }
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&local_a8,fileName,iVar6);
      bVar5 = anon_unknown_0::readScanline<Imf_3_4::InputFile>
                        ((InputFile *)&local_a8,reduceTime,reduceTime_01);
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
      }
      bVar3 = bVar11;
      if (((bVar5) && (bVar3 = true, local_d0 == DAT_0012aa60)) && (bVar3 = bVar11, local_d0 != 0))
      {
        iVar6 = bcmp(local_d8,DEEPTILE_abi_cxx11_,local_d0);
        bVar3 = true;
        if (iVar6 == 0) {
          bVar3 = bVar11;
        }
      }
    }
    bVar11 = bVar3;
    if ((!reduceMemory) || (!bVar12)) {
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_a8,fileName,iVar6);
      bVar5 = anon_unknown_0::readTile<Imf_3_4::TiledInputFile>
                        ((TiledInputFile *)&local_a8,reduceMemory,reduceTime);
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
      }
      if ((bVar5) && (local_d0 == DAT_0012aa20)) {
        if (local_d0 == 0) {
          bVar11 = true;
        }
        else {
          iVar6 = bcmp(local_d8,TILEDIMAGE_abi_cxx11_,local_d0);
          bVar11 = true;
          if (iVar6 != 0) {
            bVar11 = bVar3;
          }
        }
      }
    }
    bVar5 = bVar11;
    if (!reduceMemory) {
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&local_a8,fileName,iVar6);
      bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_4::DeepScanLineInputFile>
                        ((DeepScanLineInputFile *)&local_a8,reduceTime,reduceTime_02);
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
      }
      if ((bVar3) && (local_d0 == DAT_0012aa40)) {
        if (local_d0 == 0) {
          bVar5 = true;
        }
        else {
          iVar6 = bcmp(local_d8,DEEPSCANLINE_abi_cxx11_,local_d0);
          bVar5 = true;
          if (iVar6 != 0) {
            bVar5 = bVar11;
          }
        }
      }
    }
    bVar3 = bVar5;
    if ((!reduceMemory) || (!bVar12)) {
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::DeepTiledInputFile::DeepTiledInputFile
                ((DeepTiledInputFile *)&local_a8,fileName,iVar6);
      bVar12 = anon_unknown_0::readDeepTile<Imf_3_4::DeepTiledInputFile>
                         ((DeepTiledInputFile *)&local_a8,reduceMemory,reduceTime);
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
      }
      if ((bVar12) && (local_d0 == DAT_0012aa60)) {
        if (local_d0 == 0) {
          bVar3 = true;
        }
        else {
          iVar6 = bcmp(local_d8,DEEPTILE_abi_cxx11_,local_d0);
          bVar3 = true;
          if (iVar6 != 0) {
            bVar3 = bVar5;
          }
        }
      }
    }
    Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(local_38);
    Imf_3_4::Header::setMaxImageSize(local_ac,local_b0);
    Imf_3_4::Header::setMaxTileSize(local_b4,local_b8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    }
  }
  else {
    local_58 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = 0;
    local_a8 = 0x68;
    uStack_50 = 0xbf800000fffffffe;
    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 anon_unknown_0::core_error_handler_cb;
    if (reduceMemory || reduceTime) {
      uStack_60 = 0x80000000800;
      local_58 = 0x20000000200;
    }
    iVar6 = exr_start_read(&local_d8,fileName,&local_a8);
    bVar3 = true;
    if (iVar6 == 0) {
      bVar3 = anon_unknown_0::checkCoreFile(local_d8,reduceMemory,reduceTime);
      exr_finish(&local_d8);
    }
  }
  return bVar3;
}

Assistant:

bool
checkOpenEXRFile (
    const char* fileName, bool reduceMemory, bool reduceTime, bool runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (fileName, reduceMemory, reduceTime);
    }
    else { return runChecks (fileName, reduceMemory, reduceTime); }
}